

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::analyze_interlocked_resource_usage(Compiler *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  SPIREntryPoint *pSVar5;
  SPIRFunction *pSVar6;
  FunctionID *this_00;
  bool local_109;
  byte local_f5;
  undefined1 local_d0 [8];
  InterlockedResourceAccessHandler handler;
  undefined1 local_68 [8];
  InterlockedResourceAccessPrepassHandler prepass_handler;
  Compiler *this_local;
  
  prepass_handler.call_stack.stack_storage.aligned_char._24_8_ = this;
  EVar2 = get_execution_model(this);
  if (EVar2 == ExecutionModelFragment) {
    pSVar5 = get_entry_point(this);
    bVar1 = Bitset::get(&pSVar5->flags,0x14f6);
    if (!bVar1) {
      pSVar5 = get_entry_point(this);
      bVar1 = Bitset::get(&pSVar5->flags,0x14f7);
      if (!bVar1) {
        pSVar5 = get_entry_point(this);
        bVar1 = Bitset::get(&pSVar5->flags,0x14f8);
        if (!bVar1) {
          pSVar5 = get_entry_point(this);
          bVar1 = Bitset::get(&pSVar5->flags,0x14f9);
          if (!bVar1) {
            return;
          }
        }
      }
    }
    this_00 = &(this->ir).default_entry_point;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)this_00);
    InterlockedResourceAccessPrepassHandler::InterlockedResourceAccessPrepassHandler
              ((InterlockedResourceAccessPrepassHandler *)local_68,this,uVar3);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)this_00);
    pSVar6 = get<spirv_cross::SPIRFunction>(this,uVar3);
    traverse_all_reachable_opcodes(this,pSVar6,(OpcodeHandler *)local_68);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
    InterlockedResourceAccessHandler::InterlockedResourceAccessHandler
              ((InterlockedResourceAccessHandler *)local_d0,this,uVar3);
    handler.compiler._4_4_ = (uint32_t)prepass_handler.compiler;
    handler.in_crit_sec = (bool)((byte)prepass_handler.interlock_function_id & 1);
    handler._17_1_ = prepass_handler.interlock_function_id._1_1_ & 1;
    local_f5 = 0;
    if (handler.in_crit_sec == false) {
      local_f5 = handler._17_1_ ^ 0xff;
    }
    handler._18_1_ = local_f5 & 1;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
    pSVar6 = get<spirv_cross::SPIRFunction>(this,uVar3);
    traverse_all_reachable_opcodes(this,pSVar6,(OpcodeHandler *)local_d0);
    uVar3 = handler.compiler._4_4_;
    local_109 = true;
    if ((handler._18_1_ & 1) != 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
      local_109 = uVar3 != uVar4;
    }
    this->interlocked_is_complex = local_109;
    InterlockedResourceAccessHandler::~InterlockedResourceAccessHandler
              ((InterlockedResourceAccessHandler *)local_d0);
    InterlockedResourceAccessPrepassHandler::~InterlockedResourceAccessPrepassHandler
              ((InterlockedResourceAccessPrepassHandler *)local_68);
  }
  return;
}

Assistant:

void Compiler::analyze_interlocked_resource_usage()
{
	if (get_execution_model() == ExecutionModelFragment &&
	    (get_entry_point().flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	     get_entry_point().flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	     get_entry_point().flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	     get_entry_point().flags.get(ExecutionModeSampleInterlockUnorderedEXT)))
	{
		InterlockedResourceAccessPrepassHandler prepass_handler(*this, ir.default_entry_point);
		traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), prepass_handler);

		InterlockedResourceAccessHandler handler(*this, ir.default_entry_point);
		handler.interlock_function_id = prepass_handler.interlock_function_id;
		handler.split_function_case = prepass_handler.split_function_case;
		handler.control_flow_interlock = prepass_handler.control_flow_interlock;
		handler.use_critical_section = !handler.split_function_case && !handler.control_flow_interlock;

		traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

		// For GLSL. If we hit any of these cases, we have to fall back to conservative approach.
		interlocked_is_complex =
		    !handler.use_critical_section || handler.interlock_function_id != ir.default_entry_point;
	}
}